

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

void Int8_To_Float32(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                    int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  char cVar1;
  float *dest;
  
  if (count != 0) {
    do {
      cVar1 = *sourceBuffer;
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride);
      *(float *)destinationBuffer = (float)(int)cVar1 * 0.0078125;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Int8_To_Float32(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    signed char *src = (signed char*)sourceBuffer;
    float *dest =  (float*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        float samp = *src * const_1_div_128_;
        *dest = samp;

        src += sourceStride;
        dest += destinationStride;
    }
}